

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman_tests.cpp
# Opt level: O0

void __thiscall wallet::scriptpubkeyman_tests::CanProvide::test_method(CanProvide *this)

{
  bool bVar1;
  int iVar2;
  LegacyScriptPubKeyMan *pLVar3;
  long in_FS_OFFSET;
  CKey *key;
  vector<CKey,_std::allocator<CKey>_> *__range2;
  LegacyScriptPubKeyMan *keyman;
  iterator __end2;
  iterator __begin2;
  vector<CPubKey,_std::allocator<CPubKey>_> pubkeys;
  vector<CKey,_std::allocator<CKey>_> keys;
  SignatureData data;
  CScript p2sh_script;
  CScript multisig_script;
  CWallet wallet;
  SignatureData *in_stack_fffffffffffff478;
  undefined7 in_stack_fffffffffffff480;
  undefined1 in_stack_fffffffffffff487;
  CWallet *in_stack_fffffffffffff488;
  undefined7 in_stack_fffffffffffff490;
  undefined1 in_stack_fffffffffffff497;
  allocator_type *in_stack_fffffffffffff498;
  undefined7 in_stack_fffffffffffff4a0;
  undefined1 in_stack_fffffffffffff4a7;
  vector<CKey,_std::allocator<CKey>_> *in_stack_fffffffffffff4a8;
  size_t line_num;
  undefined7 in_stack_fffffffffffff4b0;
  undefined1 in_stack_fffffffffffff4b7;
  lazy_ostream *in_stack_fffffffffffff4b8;
  undefined7 in_stack_fffffffffffff4c0;
  undefined1 in_stack_fffffffffffff4c7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4c8;
  SignatureData *this_00;
  const_string local_ad0 [2];
  lazy_ostream local_ab0 [2];
  assertion_result local_a90;
  undefined4 in_stack_fffffffffffff588;
  undefined4 in_stack_fffffffffffff58c;
  string *in_stack_fffffffffffff590;
  Chain *in_stack_fffffffffffff598;
  CWallet *in_stack_fffffffffffff5a0;
  lazy_ostream local_a38 [2];
  assertion_result local_a18;
  undefined1 local_9b0 [40];
  undefined1 local_988 [1016];
  undefined1 local_590 [32];
  undefined1 local_570 [104];
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_fffffffffffff478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff4c8,
             (char *)CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0),
             (allocator<char> *)in_stack_fffffffffffff4b8);
  local_4e8 = 0;
  uStack_4e0 = 0;
  local_4f8 = 0;
  uStack_4f0 = 0;
  local_508 = 0;
  uStack_500 = 0;
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
         *)in_stack_fffffffffffff478);
  CreateMockableWalletDatabase((MockableData *)in_stack_fffffffffffff488);
  CWallet::CWallet(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                    *)CONCAT44(in_stack_fffffffffffff58c,in_stack_fffffffffffff588));
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffff488);
  std::
  map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~map((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
          *)in_stack_fffffffffffff478);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff478);
  std::allocator<char>::~allocator((allocator<char> *)(local_9b0 + 0x27));
  pLVar3 = CWallet::GetOrCreateLegacyScriptPubKeyMan(in_stack_fffffffffffff488);
  std::allocator<CKey>::allocator((allocator<CKey> *)in_stack_fffffffffffff478);
  std::vector<CKey,_std::allocator<CKey>_>::vector
            (in_stack_fffffffffffff4a8,CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0)
             ,in_stack_fffffffffffff498);
  std::allocator<CKey>::~allocator((allocator<CKey> *)in_stack_fffffffffffff478);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffff478);
  this_00 = (SignatureData *)local_9b0;
  std::vector<CKey,_std::allocator<CKey>_>::begin
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  std::vector<CKey,_std::allocator<CKey>_>::end
            ((vector<CKey,_std::allocator<CKey>_> *)
             CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  while( true ) {
    bVar1 = __gnu_cxx::operator==<CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>
                      ((__normal_iterator<CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_> *)
                       in_stack_fffffffffffff488,
                       (__normal_iterator<CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_> *)
                       CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::__normal_iterator<CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>::operator*
              ((__normal_iterator<CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_> *)
               in_stack_fffffffffffff478);
    CKey::MakeNewKey((CKey *)in_stack_fffffffffffff488,(bool)in_stack_fffffffffffff487);
    CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0));
    std::vector<CPubKey,_std::allocator<CPubKey>_>::emplace_back<CPubKey>
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffff498,
               (CPubKey *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
    __gnu_cxx::__normal_iterator<CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_>::operator++
              ((__normal_iterator<CKey_*,_std::vector<CKey,_std::allocator<CKey>_>_> *)
               in_stack_fffffffffffff478);
  }
  GetScriptForMultisig
            ((int)((ulong)in_stack_fffffffffffff4c8 >> 0x20),
             (vector<CPubKey,_std::allocator<CPubKey>_> *)
             CONCAT17(in_stack_fffffffffffff4c7,in_stack_fffffffffffff4c0));
  ScriptHash::ScriptHash
            ((ScriptHash *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (CScript *)in_stack_fffffffffffff488);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff488,
             (ScriptHash *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480));
  GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff478);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff478);
  SignatureData::SignatureData(this_00);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488,
               (pointer)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
               (unsigned_long)in_stack_fffffffffffff478);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff478);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff4b7,in_stack_fffffffffffff4b0),
               (size_t)in_stack_fffffffffffff4a8,
               (const_string *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0));
    (*(pLVar3->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x16])
              (pLVar3,local_590,local_988);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff488,(bool)in_stack_fffffffffffff487);
    in_stack_fffffffffffff4b8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488,
               (pointer)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
               (unsigned_long)in_stack_fffffffffffff478);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
               (basic_cstring<const_char> *)in_stack_fffffffffffff478);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488,
               (pointer)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
               (unsigned_long)in_stack_fffffffffffff478);
    in_stack_fffffffffffff478 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_a18,local_a38,(const_string *)&stack0xfffffffffffff5a8,0x26,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff478);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff478);
    in_stack_fffffffffffff4b7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff4b7);
  (*(pLVar3->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x24])
            (pLVar3,local_570);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488,
               (pointer)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
               (unsigned_long)in_stack_fffffffffffff478);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff478);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff4b8,
               (const_string *)CONCAT17(in_stack_fffffffffffff4b7,in_stack_fffffffffffff4b0),
               line_num,(const_string *)
                        CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0));
    iVar2 = (*(pLVar3->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x16])
                      (pLVar3,local_590,local_988);
    in_stack_fffffffffffff4a7 = (undefined1)iVar2;
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff488,(bool)in_stack_fffffffffffff487);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488,
               (pointer)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
               (unsigned_long)in_stack_fffffffffffff478);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
               (basic_cstring<const_char> *)in_stack_fffffffffffff478);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff488,
               (pointer)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
               (unsigned_long)in_stack_fffffffffffff478);
    in_stack_fffffffffffff478 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_a90,local_ab0,local_ad0,0x28,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff478);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff478);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  SignatureData::~SignatureData(in_stack_fffffffffffff478);
  CScript::~CScript((CScript *)in_stack_fffffffffffff478);
  CScript::~CScript((CScript *)in_stack_fffffffffffff478);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::~vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffff488);
  std::vector<CKey,_std::allocator<CKey>_>::~vector
            ((vector<CKey,_std::allocator<CKey>_> *)in_stack_fffffffffffff488);
  CWallet::~CWallet(in_stack_fffffffffffff488);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(CanProvide)
{
    // Set up wallet and keyman variables.
    CWallet wallet(m_node.chain.get(), "", CreateMockableWalletDatabase());
    LegacyScriptPubKeyMan& keyman = *wallet.GetOrCreateLegacyScriptPubKeyMan();

    // Make a 1 of 2 multisig script
    std::vector<CKey> keys(2);
    std::vector<CPubKey> pubkeys;
    for (CKey& key : keys) {
        key.MakeNewKey(true);
        pubkeys.emplace_back(key.GetPubKey());
    }
    CScript multisig_script = GetScriptForMultisig(1, pubkeys);
    CScript p2sh_script = GetScriptForDestination(ScriptHash(multisig_script));
    SignatureData data;

    // Verify the p2sh(multisig) script is not recognized until the multisig
    // script is added to the keystore to make it solvable
    BOOST_CHECK(!keyman.CanProvide(p2sh_script, data));
    keyman.AddCScript(multisig_script);
    BOOST_CHECK(keyman.CanProvide(p2sh_script, data));
}